

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy_prop_arrays.cpp
# Opt level: O1

unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
 __thiscall
spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromInsert
          (CopyPropagateArrays *this,Instruction *insert_inst)

{
  IRContext *pIVar1;
  DefUseManager *pDVar2;
  TypeManager *this_00;
  pointer pAVar3;
  pointer pAVar4;
  bool bVar5;
  uint32_t uVar6;
  uint32_t uVar7;
  Type *type;
  Instruction *this_01;
  Instruction *in_RDX;
  pointer *__ptr;
  uint uVar8;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  current_memory_object;
  unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
  memory_object;
  AccessChainEntry current_last_access;
  AccessChainEntry last_access;
  undefined1 local_58 [8];
  undefined1 local_50 [16];
  AccessChainEntry local_40;
  AccessChainEntry local_38;
  
  if (in_RDX->opcode_ != OpCompositeInsert) {
    __assert_fail("insert_inst->opcode() == spv::Op::OpCompositeInsert && \"Expecting an OpCompositeInsert instruction.\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/copy_prop_arrays.cpp"
                  ,0x194,
                  "std::unique_ptr<CopyPropagateArrays::MemoryObject> spvtools::opt::CopyPropagateArrays::BuildMemoryObjectFromInsert(Instruction *)"
                 );
  }
  pIVar1 = *(IRContext **)&insert_inst->opcode_;
  if ((pIVar1->valid_analyses_ & kAnalysisBegin) == kAnalysisNone) {
    IRContext::BuildDefUseManager(pIVar1);
  }
  pDVar2 = (pIVar1->def_use_mgr_)._M_t.
           super___uniq_ptr_impl<spvtools::opt::analysis::DefUseManager,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           ._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::analysis::DefUseManager_*,_std::default_delete<spvtools::opt::analysis::DefUseManager>_>
           .super__Head_base<0UL,_spvtools::opt::analysis::DefUseManager_*,_false>._M_head_impl;
  pIVar1 = *(IRContext **)&insert_inst->opcode_;
  if ((pIVar1->valid_analyses_ & kAnalysisTypes) == kAnalysisNone) {
    IRContext::BuildTypeManager(pIVar1);
  }
  this_00 = (pIVar1->type_mgr_)._M_t.
            super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            ._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
            .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  uVar6 = 0;
  if (in_RDX->has_type_id_ == true) {
    uVar6 = Instruction::GetSingleWordOperand(in_RDX,0);
  }
  type = analysis::TypeManager::GetType(this_00,uVar6);
  uVar6 = anon_unknown_0::GetNumberOfMembers(type,*(IRContext **)&insert_inst->opcode_);
  if (uVar6 == 0) {
LAB_00553215:
    (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
    return (__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
            )(__uniq_ptr_data<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>,_true,_true>
              )this;
  }
  uVar8 = (in_RDX->has_result_id_ & 1) + 1;
  if (in_RDX->has_type_id_ == false) {
    uVar8 = (uint)in_RDX->has_result_id_;
  }
  if ((int)((ulong)((long)(in_RDX->operands_).
                          super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(in_RDX->operands_).
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 - uVar8 != 3
     ) goto LAB_00553215;
  uVar7 = Instruction::GetSingleWordOperand(in_RDX,uVar8 + 2);
  if (uVar7 != uVar6 - 1) goto LAB_00553215;
  uVar7 = (in_RDX->has_result_id_ & 1) + 1;
  if (in_RDX->has_type_id_ == false) {
    uVar7 = (uint)in_RDX->has_result_id_;
  }
  local_50._8_8_ = pDVar2;
  Instruction::GetSingleWordOperand(in_RDX,uVar7);
  GetSourceObjectIfAny((CopyPropagateArrays *)local_50,(uint32_t)insert_inst);
  if (((MemoryObject *)local_50._0_8_ != (MemoryObject *)0x0) &&
     ((((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
         *)(local_50._0_8_ + 8))->
      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
      )._M_impl.super__Vector_impl_data._M_start != *(pointer *)(local_50._0_8_ + 0x10))) {
    local_38 = (*(pointer *)(local_50._0_8_ + 0x10))[-1];
    bVar5 = IsAccessChainIndexValidAndEqualTo
                      ((CopyPropagateArrays *)insert_inst,&local_38,uVar6 - 1);
    if (bVar5) {
      MemoryObject::PopIndirection((MemoryObject *)local_50._0_8_);
      uVar8 = (in_RDX->has_result_id_ & 1) + 1;
      if (in_RDX->has_type_id_ == false) {
        uVar8 = (uint)in_RDX->has_result_id_;
      }
      uVar7 = Instruction::GetSingleWordOperand(in_RDX,uVar8 + 1);
      this_01 = analysis::DefUseManager::GetDef((DefUseManager *)local_50._8_8_,uVar7);
      uVar6 = uVar6 - 2;
      do {
        if (uVar6 == 0xffffffff) {
          (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)local_50._0_8_;
          local_50._0_8_ = (MemoryObject *)0x0;
          break;
        }
        if (this_01->opcode_ != OpCompositeInsert) goto LAB_0055322e;
        uVar8 = (this_01->has_result_id_ & 1) + 1;
        if (this_01->has_type_id_ == false) {
          uVar8 = (uint)this_01->has_result_id_;
        }
        if (((int)((ulong)((long)(this_01->operands_).
                                 super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                 ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this_01->operands_).
                                super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                                ._M_impl.super__Vector_impl_data._M_start) >> 4) * -0x55555555 -
             uVar8 != 3) ||
           (uVar7 = Instruction::GetSingleWordOperand(this_01,uVar8 + 2), uVar6 != uVar7))
        goto LAB_0055322e;
        uVar7 = (this_01->has_result_id_ & 1) + 1;
        if (this_01->has_type_id_ == false) {
          uVar7 = (uint)this_01->has_result_id_;
        }
        Instruction::GetSingleWordOperand(this_01,uVar7);
        GetSourceObjectIfAny((CopyPropagateArrays *)local_58,(uint32_t)insert_inst);
        if ((local_58 == (undefined1  [8])0x0) ||
           (pAVar3 = (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                        *)((long)local_58 + 8))->
                     super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                     )._M_impl.super__Vector_impl_data._M_start,
           pAVar3 == (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                        *)((long)local_58 + 8))->
                     super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                     )._M_impl.super__Vector_impl_data._M_finish)) {
          (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
          bVar5 = false;
        }
        else {
          pAVar4 = (((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                      *)((long)local_58 + 8))->
                   super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          if ((((long)*(pointer *)(local_50._0_8_ + 0x10) -
                (long)(((vector<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                         *)(local_50._0_8_ + 8))->
                      super__Vector_base<spvtools::opt::CopyPropagateArrays::AccessChainEntry,_std::allocator<spvtools::opt::CopyPropagateArrays::AccessChainEntry>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) + 1 ==
               (long)pAVar4 - (long)pAVar3 >> 3) &&
             (bVar5 = MemoryObject::Contains
                                ((MemoryObject *)local_50._0_8_,(MemoryObject *)local_58), bVar5)) {
            local_40 = pAVar4[-1];
            bVar5 = IsAccessChainIndexValidAndEqualTo
                              ((CopyPropagateArrays *)insert_inst,&local_40,uVar6);
            if (bVar5) {
              uVar8 = (this_01->has_result_id_ & 1) + 1;
              if (this_01->has_type_id_ == false) {
                uVar8 = (uint)this_01->has_result_id_;
              }
              uVar7 = Instruction::GetSingleWordOperand(this_01,uVar8 + 1);
              this_01 = analysis::DefUseManager::GetDef((DefUseManager *)local_50._8_8_,uVar7);
            }
            else {
              (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
            }
          }
          else {
            (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
            bVar5 = false;
          }
        }
        if (local_58 != (undefined1  [8])0x0) {
          std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
                    ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)local_58,
                     (MemoryObject *)local_58);
        }
        uVar6 = uVar6 - 1;
      } while (bVar5 != false);
      goto LAB_00553235;
    }
  }
LAB_0055322e:
  (this->super_MemPass).super_Pass._vptr_Pass = (_func_int **)0x0;
LAB_00553235:
  if ((MemoryObject *)local_50._0_8_ == (MemoryObject *)0x0) {
    return (unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
            )this;
  }
  std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>::operator()
            ((default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject> *)local_50,
             (MemoryObject *)local_50._0_8_);
  return (unique_ptr<spvtools::opt::CopyPropagateArrays::MemoryObject,_std::default_delete<spvtools::opt::CopyPropagateArrays::MemoryObject>_>
          )this;
}

Assistant:

std::unique_ptr<CopyPropagateArrays::MemoryObject>
CopyPropagateArrays::BuildMemoryObjectFromInsert(Instruction* insert_inst) {
  assert(insert_inst->opcode() == spv::Op::OpCompositeInsert &&
         "Expecting an OpCompositeInsert instruction.");

  analysis::DefUseManager* def_use_mgr = context()->get_def_use_mgr();
  analysis::TypeManager* type_mgr = context()->get_type_mgr();
  const analysis::Type* result_type = type_mgr->GetType(insert_inst->type_id());

  uint32_t number_of_elements = GetNumberOfMembers(result_type, context());

  if (number_of_elements == 0) {
    return nullptr;
  }

  if (insert_inst->NumInOperands() != 3) {
    return nullptr;
  }

  if (insert_inst->GetSingleWordInOperand(2) != number_of_elements - 1) {
    return nullptr;
  }

  std::unique_ptr<MemoryObject> memory_object =
      GetSourceObjectIfAny(insert_inst->GetSingleWordInOperand(0));

  if (!memory_object) {
    return nullptr;
  }

  if (!memory_object->IsMember()) {
    return nullptr;
  }

  AccessChainEntry last_access = memory_object->AccessChain().back();
  if (!IsAccessChainIndexValidAndEqualTo(last_access, number_of_elements - 1)) {
    return nullptr;
  }

  memory_object->PopIndirection();

  Instruction* current_insert =
      def_use_mgr->GetDef(insert_inst->GetSingleWordInOperand(1));
  for (uint32_t i = number_of_elements - 1; i > 0; --i) {
    if (current_insert->opcode() != spv::Op::OpCompositeInsert) {
      return nullptr;
    }

    if (current_insert->NumInOperands() != 3) {
      return nullptr;
    }

    if (current_insert->GetSingleWordInOperand(2) != i - 1) {
      return nullptr;
    }

    std::unique_ptr<MemoryObject> current_memory_object =
        GetSourceObjectIfAny(current_insert->GetSingleWordInOperand(0));

    if (!current_memory_object) {
      return nullptr;
    }

    if (!current_memory_object->IsMember()) {
      return nullptr;
    }

    if (memory_object->AccessChain().size() + 1 !=
        current_memory_object->AccessChain().size()) {
      return nullptr;
    }

    if (!memory_object->Contains(current_memory_object.get())) {
      return nullptr;
    }

    AccessChainEntry current_last_access =
        current_memory_object->AccessChain().back();
    if (!IsAccessChainIndexValidAndEqualTo(current_last_access, i - 1)) {
      return nullptr;
    }
    current_insert =
        def_use_mgr->GetDef(current_insert->GetSingleWordInOperand(1));
  }

  return memory_object;
}